

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_socket.c
# Opt level: O3

amqp_rpc_reply_t *
amqp_simple_rpc(amqp_rpc_reply_t *__return_storage_ptr__,amqp_connection_state_t state,
               amqp_channel_t channel,amqp_method_number_t request_id,
               amqp_method_number_t *expected_reply_ids,void *decoded_request_method)

{
  int iVar1;
  amqp_time_t deadline;
  amqp_time_t local_38;
  
  iVar1 = amqp_time_from_now(&local_38,state->rpc_timeout);
  if (iVar1 == 0) {
    simple_rpc_inner(__return_storage_ptr__,state,channel,request_id,expected_reply_ids,
                     decoded_request_method,local_38);
  }
  else {
    __return_storage_ptr__->reply_type = AMQP_RESPONSE_LIBRARY_EXCEPTION;
    __return_storage_ptr__->library_error = iVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

amqp_rpc_reply_t amqp_simple_rpc(amqp_connection_state_t state,
                                 amqp_channel_t channel,
                                 amqp_method_number_t request_id,
                                 amqp_method_number_t *expected_reply_ids,
                                 void *decoded_request_method) {
  amqp_time_t deadline;
  int res;

  res = amqp_time_from_now(&deadline, state->rpc_timeout);
  if (res != AMQP_STATUS_OK) {
    return amqp_rpc_reply_error(res);
  }

  return simple_rpc_inner(state, channel, request_id, expected_reply_ids,
                          decoded_request_method, deadline);
}